

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::log_internal::LogMessageQuietlyFatal::LogMessageQuietlyFatal
          (LogMessageQuietlyFatal *this,Nonnull<const_char_*> file,int line,
          Nonnull<const_char_*> failure_msg)

{
  LogMessage *this_00;
  string_view str;
  string_view str_00;
  Nonnull<const_char_*> failure_msg_local;
  
  failure_msg_local = failure_msg;
  LogMessage::LogMessage(&this->super_LogMessage,file,line,kFatal);
  ((this->super_LogMessage).data_._M_t.
   super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
   ._M_t.
   super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
   .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl)->fail_quietly = true;
  str._M_str = "Check failed: ";
  str._M_len = 0xe;
  LogMessage::CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
            (&this->super_LogMessage,str);
  this_00 = LogMessage::operator<<<const_char_*,_0>(&this->super_LogMessage,&failure_msg_local);
  str_00._M_str = " ";
  str_00._M_len = 1;
  LogMessage::CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
            (this_00,str_00);
  return;
}

Assistant:

LogMessageQuietlyFatal::LogMessageQuietlyFatal(
    absl::Nonnull<const char*> file, int line,
    absl::Nonnull<const char*> failure_msg)
    : LogMessageQuietlyFatal(file, line) {
  *this << "Check failed: " << failure_msg << " ";
}